

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

iterator __thiscall
Corrade::Utility::ConfigurationGroup::findGroup(ConfigurationGroup *this,string *name,uint index)

{
  bool bVar1;
  __type _Var2;
  pointer __lhs;
  iterator iVar3;
  __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
  local_30;
  uint local_28;
  uint local_24;
  uint foundIndex;
  uint index_local;
  string *name_local;
  ConfigurationGroup *this_local;
  iterator it;
  
  local_28 = 0;
  local_24 = index;
  _foundIndex = name;
  name_local = (string *)this;
  this_local = (ConfigurationGroup *)
               std::
               vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
               ::begin(&this->_groups);
  while( true ) {
    local_30._M_current =
         (Group *)std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::end(&this->_groups);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
                        *)&this_local,&local_30);
    if (!bVar1) {
      iVar3 = std::
              vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
              ::end(&this->_groups);
      return (iterator)iVar3._M_current;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
            ::operator->((__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
                          *)&this_local);
    _Var2 = std::operator==(&__lhs->name,_foundIndex);
    if ((_Var2) && (bVar1 = local_28 == local_24, local_28 = local_28 + 1, bVar1)) break;
    __gnu_cxx::
    __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
    ::operator++((__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
                  *)&this_local);
  }
  return (iterator)(Group *)this_local;
}

Assistant:

auto ConfigurationGroup::findGroup(const std::string& name, const unsigned int index) -> std::vector<Group>::iterator {
    unsigned int foundIndex = 0;
    for(auto it = _groups.begin(); it != _groups.end(); ++it)
        if(it->name == name && foundIndex++ == index) return it;

    return _groups.end();
}